

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_tu(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,uint32_t cMax,
                 uint32_t *val)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t tmp;
  uint32_t tmp_1;
  uint32_t *local_40;
  int *local_38;
  
  local_40 = val;
  local_38 = ctxIdx;
  if (str->dir == VS_ENCODE) {
    if (cMax < *val) {
      fwrite("TU value over limit\n",0x14,1,_stderr);
    }
    else {
      uVar5 = 0;
      do {
        if ((cMax <= uVar5) || (uVar2 = *local_40, uVar5 >= uVar2 && uVar5 != uVar2))
        goto LAB_0010c73c;
        tmp_1 = (uint32_t)(uVar5 < uVar2);
        uVar2 = numidx - 1;
        if ((int)uVar5 < numidx) {
          uVar2 = uVar5;
        }
        iVar1 = h264_cabac_decision(str,cabac,local_38[(int)uVar2],&tmp_1);
        uVar5 = uVar5 + 1;
      } while (iVar1 == 0);
    }
LAB_0010c72e:
    iVar1 = 1;
  }
  else {
    tmp = 1;
    for (uVar4 = 0; uVar3 = cMax, cMax != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = numidx - 1;
      if ((int)uVar4 < numidx) {
        uVar3 = uVar4;
      }
      iVar1 = h264_cabac_decision(str,cabac,local_38[(int)uVar3],&tmp);
      if (iVar1 != 0) goto LAB_0010c72e;
      uVar3 = uVar4;
      if (tmp == 0) break;
    }
    *local_40 = uVar3;
LAB_0010c73c:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int h264_cabac_tu(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, uint32_t cMax, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i;
		if (*val > cMax) {
			fprintf(stderr, "TU value over limit\n");
			return 1;
		}
		for (i = 0; i <= *val && i < cMax; i++) {
			uint32_t tmp = i < *val;
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
		}
		return 0;
	} else {
		int i;
		uint32_t tmp = 1;
		for (i = 0; i < cMax; i++) {
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
			if (!tmp)
				break;
		}
		*val = i;
		return 0;		
	}
}